

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_BlindTransaction_Test::TestBody
          (ConfidentialTransactionContext_BlindTransaction_Test *this)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  size_type sVar4;
  char *pcVar5;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  char *in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>,_bool>
  pVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>,_bool>
  pVar7;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> unblind_param;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  AssertionResult gtest_ar;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  confidential_key_list;
  map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
  issuance_key_map;
  map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
  utxo_info_map;
  BlindParameter utxo_param;
  IssuanceBlindingKeyPair issue_key;
  Privkey master_blinding_key;
  IssuanceOutputParameter token_output;
  IssuanceOutputParameter issue_output;
  IssuanceParameter param;
  bool is_blind;
  ByteData256 contract_hash;
  ElementsConfidentialAddress token_address;
  ElementsConfidentialAddress asset_address;
  ElementsConfidentialAddress address;
  Amount token_amount;
  Amount asset_amount;
  OutPoint outpoint;
  ConfidentialTransactionContext tx;
  string tx_base;
  ConfidentialTxOutReference *in_stack_ffffffffffffe8b8;
  IssuanceOutputParameter *in_stack_ffffffffffffe8c0;
  OutPoint *in_stack_ffffffffffffe8c8;
  IssuanceBlindingKeyPair *in_stack_ffffffffffffe8d0;
  char *in_stack_ffffffffffffe8d8;
  undefined7 in_stack_ffffffffffffe8e0;
  undefined1 in_stack_ffffffffffffe8e7;
  AssertHelper local_15b8;
  Message local_15b0;
  undefined8 local_15a8;
  undefined8 local_15a0;
  undefined1 local_1598;
  undefined8 local_1590;
  undefined1 local_1588;
  undefined8 local_1580;
  AssertionResult local_1578;
  AssertHelper local_1568;
  Message local_1560;
  string local_1558 [32];
  string local_1538 [32];
  AssertionResult local_1518;
  AssertHelper local_1508;
  Message local_1500;
  undefined8 local_14f8;
  undefined8 local_14f0;
  undefined1 local_14e8;
  undefined8 local_14e0;
  undefined1 local_14d8;
  undefined8 local_14d0;
  AssertionResult local_14c8;
  AssertHelper local_14b8;
  Message local_14b0;
  string local_14a8 [32];
  string local_1488 [32];
  AssertionResult local_1468;
  AssertHelper local_1458;
  Message local_1450;
  undefined1 local_1448 [48];
  string local_1418;
  AssertHelper local_13f8;
  Message local_13f0 [6];
  byte local_13b9;
  AssertionResult local_13b8;
  string local_13a8;
  AssertHelper local_1388;
  Message local_1380 [6];
  byte local_1349;
  AssertionResult local_1348;
  string local_1338;
  AssertHelper local_1318;
  Message local_1310 [6];
  byte local_12d9;
  AssertionResult local_12d8;
  string local_12c8;
  AssertHelper local_12a8;
  Message local_12a0 [6];
  byte local_1269;
  AssertionResult local_1268;
  AssertHelper local_1258;
  Message local_1250;
  undefined4 local_1244;
  size_type local_1240;
  AssertionResult local_1238;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  local_1228 [24];
  AssertHelper local_1210;
  Message local_1208;
  undefined4 local_11fc;
  string local_11f8 [32];
  undefined8 local_11d8;
  AssertionResult local_11d0;
  AssertHelper local_11c0;
  Message local_11b8;
  undefined1 local_11b0 [24];
  _Base_ptr local_1198;
  undefined1 local_1190;
  vector local_1188 [48];
  _Base_ptr local_1158;
  undefined1 local_1150;
  map local_1148 [48];
  Amount local_1118 [16];
  ConfidentialValue local_1108;
  allocator local_10d9;
  string local_10d8 [32];
  ConfidentialAssetId local_10b8;
  ConfidentialAssetId local_1090 [2];
  ConfidentialValue local_1028;
  undefined1 local_1000 [32];
  Privkey local_fe0 [3];
  allocator local_f79;
  string local_f78 [32];
  Privkey local_f58;
  AssertHelper local_f38;
  Message local_f30 [2];
  OutPoint local_f20 [2];
  ConfidentialTxOutReference local_eb0;
  ElementsConfidentialAddress local_d38 [488];
  undefined8 local_b50;
  undefined1 local_b48;
  IssuanceOutputParameter local_b38;
  byte local_749;
  undefined1 local_748 [32];
  string local_728 [32];
  ElementsConfidentialAddress local_708 [439];
  allocator local_551;
  string local_550 [32];
  ElementsConfidentialAddress local_530 [439];
  allocator local_379;
  string local_378 [32];
  ElementsConfidentialAddress local_358 [432];
  undefined8 local_1a8;
  undefined1 local_1a0;
  undefined8 local_198;
  undefined1 local_190;
  undefined8 local_188;
  undefined1 local_180;
  Amount local_178 [23];
  allocator local_161;
  string local_160 [32];
  Txid local_140;
  undefined1 local_120 [40];
  IssuanceBlindingKeyPair local_f8 [3];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_28,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000"
             ,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)(local_120 + 0x28),local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_160,"c678107274b4d235d0e587194914b72b37b6ccd268cffad3a40194db65a33d7f",&local_161
            );
  cfd::core::Txid::Txid(&local_140,local_160);
  cfd::core::OutPoint::OutPoint((OutPoint *)local_120,&local_140,1);
  cfd::core::Txid::~Txid((Txid *)0x1e0af9);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  local_188 = cfd::core::Amount::CreateByCoinAmount(100.0);
  local_180 = extraout_DL;
  local_178._0_8_ = local_188;
  local_178[8] = (Amount)extraout_DL;
  local_1a8 = cfd::core::Amount::CreateByCoinAmount(10.0);
  local_1a0 = extraout_DL_00;
  local_198 = local_1a8;
  local_190 = extraout_DL_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_378,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz",
             &local_379);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_358,local_378);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_550,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS",
             &local_551);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_530,local_550);
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_728,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3jM5PWewjAYfWsrxrGeKAxWw6JsEGLjWym",
             (allocator *)(local_748 + 0x1f));
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_708,local_728);
  std::__cxx11::string::~string(local_728);
  std::allocator<char>::~allocator((allocator<char> *)(local_748 + 0x1f));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_748);
  local_749 = 1;
  cfd::core::IssuanceParameter::IssuanceParameter
            ((IssuanceParameter *)CONCAT17(in_stack_ffffffffffffe8e7,in_stack_ffffffffffffe8e0));
  cfd::IssuanceOutputParameter::IssuanceOutputParameter
            ((IssuanceOutputParameter *)
             CONCAT17(in_stack_ffffffffffffe8e7,in_stack_ffffffffffffe8e0));
  cfd::IssuanceOutputParameter::IssuanceOutputParameter
            ((IssuanceOutputParameter *)
             CONCAT17(in_stack_ffffffffffffe8e7,in_stack_ffffffffffffe8e0));
  cfd::core::ElementsConfidentialAddress::operator=(&local_b38.confidential_address,local_530);
  local_b38._872_1_ = local_178[8];
  local_b38.amount = local_178[0];
  local_b38._865_1_ = local_178[1];
  local_b38._866_1_ = local_178[2];
  local_b38._867_1_ = local_178[3];
  local_b38._868_1_ = local_178[4];
  local_b38._869_1_ = local_178[5];
  local_b38._870_1_ = local_178[6];
  local_b38._871_1_ = local_178[7];
  cfd::core::ElementsConfidentialAddress::operator=(local_d38,local_708);
  local_b48 = local_190;
  local_b50 = local_198;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      in_stack_ffffffffffffe8c8 = (OutPoint *)local_748;
      in_stack_ffffffffffffe8c0 =
           (IssuanceOutputParameter *)
           (CONCAT44((int)((ulong)in_stack_ffffffffffffe8c0 >> 0x20),(uint)local_749) &
           0xffffffff00000001);
      in_stack_ffffffffffffe8b8 = &local_eb0;
      in_R9 = (char *)&local_198;
      cfd::ConfidentialTransactionContext::SetAssetIssuance
                (local_f20,(Amount *)(local_120 + 0x28),(IssuanceOutputParameter *)local_120,
                 local_178,&local_b38,SUB81(in_R9,0),(ByteData256 *)in_stack_ffffffffffffe8b8);
      cfd::core::IssuanceParameter::operator=
                ((IssuanceParameter *)in_stack_ffffffffffffe8c0,
                 (IssuanceParameter *)in_stack_ffffffffffffe8b8);
      cfd::core::IssuanceParameter::~IssuanceParameter
                ((IssuanceParameter *)in_stack_ffffffffffffe8c0);
    }
  }
  else {
    testing::Message::Message(local_f30);
    testing::internal::AssertHelper::AssertHelper
              (&local_f38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x22c,
               "Expected: (param = tx.SetAssetIssuance(outpoint, asset_amount, issue_output, token_amount, token_output, is_blind, contract_hash)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_f38,local_f30);
    testing::internal::AssertHelper::~AssertHelper(&local_f38);
    testing::Message::~Message((Message *)0x1e1149);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f78,"fbbd7894006dd0e02000eb6646c6685bcceddabc8d68b93e9a1a2c78d1e7bbec",&local_f79
            );
  cfd::core::Privkey::Privkey(&local_f58,local_f78,kMainnet,true);
  std::__cxx11::string::~string(local_f78);
  std::allocator<char>::~allocator((allocator<char> *)&local_f79);
  cfd::core::IssuanceBlindingKeyPair::IssuanceBlindingKeyPair(in_stack_ffffffffffffe8d0);
  cfd::core::OutPoint::GetTxid();
  cfd::core::OutPoint::GetVout();
  cfd::core::ConfidentialTransaction::GetIssuanceBlindingKey
            (local_fe0,(Txid *)&local_f58,(uint)local_1000);
  cfd::core::Privkey::operator=
            ((Privkey *)in_stack_ffffffffffffe8c0,(Privkey *)in_stack_ffffffffffffe8b8);
  cfd::core::Privkey::~Privkey((Privkey *)0x1e1293);
  cfd::core::Txid::~Txid((Txid *)0x1e12a0);
  cfd::core::Privkey::operator=
            ((Privkey *)in_stack_ffffffffffffe8c0,(Privkey *)in_stack_ffffffffffffe8b8);
  cfd::core::UnblindParameter::UnblindParameter
            ((UnblindParameter *)CONCAT17(in_stack_ffffffffffffe8e7,in_stack_ffffffffffffe8e0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_10d8,"849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735",
             &local_10d9);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_10b8,local_10d8);
  cfd::core::ConfidentialAssetId::operator=(local_1090,&local_10b8);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x1e1334);
  std::__cxx11::string::~string(local_10d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10d9);
  cfd::core::Amount::Amount(local_1118,0x2faa260);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_1108,local_1118);
  cfd::core::ConfidentialValue::operator=(&local_1028,&local_1108);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x1e139d);
  std::
  map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
  ::map((map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
         *)0x1e13b2);
  pVar6 = std::
          map<cfd::core::OutPoint,cfd::core::UnblindParameter,std::less<cfd::core::OutPoint>,std::allocator<std::pair<cfd::core::OutPoint_const,cfd::core::UnblindParameter>>>
          ::emplace<cfd::core::OutPoint&,cfd::core::UnblindParameter&>
                    ((map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
                      *)in_stack_ffffffffffffe8d0,in_stack_ffffffffffffe8c8,
                     (UnblindParameter *)in_stack_ffffffffffffe8c0);
  local_1158 = (_Base_ptr)pVar6.first._M_node;
  local_1150 = pVar6.second;
  std::
  map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
  ::map((map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
         *)0x1e1413);
  pVar7 = std::
          map<cfd::core::OutPoint,cfd::core::IssuanceBlindingKeyPair,std::less<cfd::core::OutPoint>,std::allocator<std::pair<cfd::core::OutPoint_const,cfd::core::IssuanceBlindingKeyPair>>>
          ::emplace<cfd::core::OutPoint&,cfd::core::IssuanceBlindingKeyPair&>
                    ((map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
                      *)in_stack_ffffffffffffe8d0,in_stack_ffffffffffffe8c8,
                     (IssuanceBlindingKeyPair *)in_stack_ffffffffffffe8c0);
  local_1198 = (_Base_ptr)pVar7.first._M_node;
  local_1190 = pVar7.second;
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
            *)0x1e1474);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
               *)in_stack_ffffffffffffe8d0,(value_type *)in_stack_ffffffffffffe8c8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      in_stack_ffffffffffffe8c0 = (IssuanceOutputParameter *)0x0;
      in_stack_ffffffffffffe8b8 =
           (ConfidentialTxOutReference *)
           CONCAT44((int)((ulong)in_stack_ffffffffffffe8b8 >> 0x20),0x34);
      in_R9 = (char *)0x0;
      cfd::ConfidentialTransactionContext::BlindTransaction
                ((map *)(local_120 + 0x28),local_1148,local_1188,(long)local_11b0,1,0,
                 (vector *)in_stack_ffffffffffffe8b8);
    }
  }
  else {
    testing::Message::Message(&local_11b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_11c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x240,
               "Expected: tx.BlindTransaction( utxo_info_map, issuance_key_map, confidential_key_list) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_11c0,&local_11b8);
    testing::internal::AssertHelper::~AssertHelper(&local_11c0);
    testing::Message::~Message((Message *)0x1e1749);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  local_11d8 = std::__cxx11::string::size();
  local_11fc = 0xabde;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_ffffffffffffe8d8,(char *)in_stack_ffffffffffffe8d0,
             (unsigned_long *)in_stack_ffffffffffffe8c8,(int *)in_stack_ffffffffffffe8c0);
  std::__cxx11::string::~string(local_11f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_11d0);
  if (!bVar1) {
    testing::Message::Message(&local_1208);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e1888);
    testing::internal::AssertHelper::AssertHelper
              (&local_1210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x241,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1210,&local_1208);
    testing::internal::AssertHelper::~AssertHelper(&local_1210);
    testing::Message::~Message((Message *)0x1e18eb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e1943);
  cfd::core::ConfidentialTransaction::GetTxOutList();
  local_1240 = std::
               vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               ::size(local_1228);
  local_1244 = 4;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_ffffffffffffe8d8,(char *)in_stack_ffffffffffffe8d0,
             (unsigned_long *)in_stack_ffffffffffffe8c8,(int *)in_stack_ffffffffffffe8c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1238);
  if (!bVar1) {
    testing::Message::Message(&local_1250);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e1a2f);
    testing::internal::AssertHelper::AssertHelper
              (&local_1258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x243,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1258,&local_1250);
    testing::internal::AssertHelper::~AssertHelper(&local_1258);
    testing::Message::~Message((Message *)0x1e1a92);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e1aea);
  sVar4 = std::
          vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
          ::size(local_1228);
  if (sVar4 == 4) {
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](local_1228,0);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue(in_stack_ffffffffffffe8b8);
    local_1269 = cfd::core::ConfidentialValue::HasBlinding();
    local_1269 = local_1269 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_ffffffffffffe8c0,(bool *)in_stack_ffffffffffffe8b8,
               (type *)0x1e1b63);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x1e1b72);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1268);
    if (!bVar1) {
      testing::Message::Message(local_12a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_12c8,(internal *)&local_1268,
                 (AssertionResult *)"txouts[0].GetConfidentialValue().HasBlinding()","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_12a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x245,pcVar3);
      testing::internal::AssertHelper::operator=(&local_12a8,local_12a0);
      testing::internal::AssertHelper::~AssertHelper(&local_12a8);
      std::__cxx11::string::~string((string *)&local_12c8);
      testing::Message::~Message((Message *)0x1e1c94);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e1d0f);
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](local_1228,1);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue(in_stack_ffffffffffffe8b8);
    bVar2 = cfd::core::ConfidentialValue::HasBlinding();
    local_12d9 = ~bVar2 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_ffffffffffffe8c0,(bool *)in_stack_ffffffffffffe8b8,
               (type *)0x1e1d74);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x1e1d83);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_12d8);
    if (!bVar1) {
      testing::Message::Message(local_1310);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1338,(internal *)&local_12d8,
                 (AssertionResult *)"txouts[1].GetConfidentialValue().HasBlinding()","true","false",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1318,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x246,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1318,local_1310);
      testing::internal::AssertHelper::~AssertHelper(&local_1318);
      std::__cxx11::string::~string((string *)&local_1338);
      testing::Message::~Message((Message *)0x1e1ea5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e1f20);
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](local_1228,2);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue(in_stack_ffffffffffffe8b8);
    local_1349 = cfd::core::ConfidentialValue::HasBlinding();
    local_1349 = local_1349 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_ffffffffffffe8c0,(bool *)in_stack_ffffffffffffe8b8,
               (type *)0x1e1f83);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x1e1f92);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1348);
    if (!bVar1) {
      testing::Message::Message(local_1380);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_13a8,(internal *)&local_1348,
                 (AssertionResult *)"txouts[2].GetConfidentialValue().HasBlinding()","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1388,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x247,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1388,local_1380);
      testing::internal::AssertHelper::~AssertHelper(&local_1388);
      std::__cxx11::string::~string((string *)&local_13a8);
      testing::Message::~Message((Message *)0x1e20b4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e212f);
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](local_1228,3);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue(in_stack_ffffffffffffe8b8);
    local_13b9 = cfd::core::ConfidentialValue::HasBlinding();
    local_13b9 = local_13b9 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_ffffffffffffe8c0,(bool *)in_stack_ffffffffffffe8b8,
               (type *)0x1e2192);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x1e21a1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_13b8);
    if (!bVar1) {
      testing::Message::Message(local_13f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1418,(internal *)&local_13b8,
                 (AssertionResult *)"txouts[3].GetConfidentialValue().HasBlinding()","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_13f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x248,pcVar3);
      testing::internal::AssertHelper::operator=(&local_13f8,local_13f0);
      testing::internal::AssertHelper::~AssertHelper(&local_13f8);
      std::__cxx11::string::~string((string *)&local_1418);
      testing::Message::~Message((Message *)0x1e22c3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e233b);
  }
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::vector
            ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
             0x1e235c);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::UnblindIssuance
                ((OutPoint *)local_1448,(IssuanceBlindingKeyPair *)(local_120 + 0x28));
      std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
      operator=((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *
                )in_stack_ffffffffffffe8d0,
                (vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *
                )in_stack_ffffffffffffe8c8);
      std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
      ~vector((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
              in_stack_ffffffffffffe8d0);
    }
  }
  else {
    testing::Message::Message(&local_1450);
    testing::internal::AssertHelper::AssertHelper
              (&local_1458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x24d,
               "Expected: unblind_param = tx.UnblindIssuance(outpoint, issue_key) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1458,&local_1450);
    testing::internal::AssertHelper::~AssertHelper(&local_1458);
    testing::Message::~Message((Message *)0x1e24a1);
  }
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::operator[]
            ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
             (local_1448 + 0x18),0);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1468,"unblind_param[0].asset.GetHex().c_str()",
             "param.asset.GetHex().c_str()",pcVar3,pcVar5);
  std::__cxx11::string::~string(local_14a8);
  std::__cxx11::string::~string(local_1488);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1468);
  if (!bVar1) {
    testing::Message::Message(&local_14b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e2630);
    testing::internal::AssertHelper::AssertHelper
              (&local_14b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x24e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_14b8,&local_14b0);
    testing::internal::AssertHelper::~AssertHelper(&local_14b8);
    testing::Message::~Message((Message *)0x1e2693);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e26eb);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::operator[]
            ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
             (local_1448 + 0x18),0);
  local_14f0 = cfd::core::ConfidentialValue::GetAmount();
  local_14e8 = extraout_DL_01;
  local_14e0 = local_14f0;
  local_14d8 = extraout_DL_01;
  local_14d0 = cfd::core::Amount::GetSatoshiValue();
  local_14f8 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::EqHelper<false>::Compare<long,long>
            (in_stack_ffffffffffffe8d8,(char *)in_stack_ffffffffffffe8d0,
             (long *)in_stack_ffffffffffffe8c8,(long *)in_stack_ffffffffffffe8c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_14c8);
  if (!bVar1) {
    testing::Message::Message(&local_1500);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e2833);
    testing::internal::AssertHelper::AssertHelper
              (&local_1508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x24f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1508,&local_1500);
    testing::internal::AssertHelper::~AssertHelper(&local_1508);
    testing::Message::~Message((Message *)0x1e2890);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e28e8);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::operator[]
            ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
             (local_1448 + 0x18),1);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1518,"unblind_param[1].asset.GetHex().c_str()",
             "param.token.GetHex().c_str()",pcVar3,pcVar5);
  std::__cxx11::string::~string(local_1558);
  std::__cxx11::string::~string(local_1538);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1518);
  if (!bVar1) {
    testing::Message::Message(&local_1560);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e2a33);
    testing::internal::AssertHelper::AssertHelper
              (&local_1568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x250,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1568,&local_1560);
    testing::internal::AssertHelper::~AssertHelper(&local_1568);
    testing::Message::~Message((Message *)0x1e2a90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e2ae8);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::operator[]
            ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
             (local_1448 + 0x18),1);
  local_15a0 = cfd::core::ConfidentialValue::GetAmount();
  local_1598 = extraout_DL_02;
  local_1590 = local_15a0;
  local_1588 = extraout_DL_02;
  local_1580 = cfd::core::Amount::GetSatoshiValue();
  local_15a8 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::EqHelper<false>::Compare<long,long>
            (in_stack_ffffffffffffe8d8,(char *)in_stack_ffffffffffffe8d0,
             (long *)in_stack_ffffffffffffe8c8,(long *)in_stack_ffffffffffffe8c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1578);
  if (!bVar1) {
    testing::Message::Message(&local_15b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e2c1f);
    testing::internal::AssertHelper::AssertHelper
              (&local_15b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x251,pcVar3);
    testing::internal::AssertHelper::operator=(&local_15b8,&local_15b0);
    testing::internal::AssertHelper::~AssertHelper(&local_15b8);
    testing::Message::~Message((Message *)0x1e2c7c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e2cd4);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::~vector
            ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
             in_stack_ffffffffffffe8d0);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             *)in_stack_ffffffffffffe8d0);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
             *)in_stack_ffffffffffffe8d0);
  std::
  map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
  ::~map((map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
          *)0x1e2d08);
  std::
  map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
  ::~map((map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
          *)0x1e2d15);
  cfd::core::UnblindParameter::~UnblindParameter((UnblindParameter *)in_stack_ffffffffffffe8c0);
  cfd::core::IssuanceBlindingKeyPair::~IssuanceBlindingKeyPair
            ((IssuanceBlindingKeyPair *)in_stack_ffffffffffffe8c0);
  cfd::core::Privkey::~Privkey((Privkey *)0x1e2d3c);
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter(in_stack_ffffffffffffe8c0);
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter(in_stack_ffffffffffffe8c0);
  cfd::core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)in_stack_ffffffffffffe8c0);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x1e2d70);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)in_stack_ffffffffffffe8c0);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)in_stack_ffffffffffffe8c0);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)in_stack_ffffffffffffe8c0);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x1e2da4);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_ffffffffffffe8c0);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, BlindTransaction)
{
  std::string tx_base =
      "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000";

  // blinding key
  // pubkey: '02283059264b09d28d56d440f11ab69c9af8f09dfd8b0c3b30acc545fc0a5c6d13',
  // privkey: '0245a1b3f51d6fe1c4bddc6764cf98a0fe50dba470b8b28c47485112c3f8c9b5'

  // set issue
  ConfidentialTransactionContext tx(tx_base);
  OutPoint outpoint(Txid("c678107274b4d235d0e587194914b72b37b6ccd268cffad3a40194db65a33d7f"), 1);
  Amount asset_amount = Amount::CreateByCoinAmount(100.0);
  Amount token_amount = Amount::CreateByCoinAmount(10.0);
  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  // pubkey: '023c10299d5e5e7586694f5bdf74535e4fdade72f266ed56f761cf7b1e4c61dad4',
  // privkey: 'cUbox87hNNTuqTACDBc6YKU2mA21Pqt6BjZGVogusp766QVxypKg'
  ElementsConfidentialAddress address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz");
  // "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z"
  ElementsConfidentialAddress asset_address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS");
  // "2dqLgUheB1R4gw7G2DKuxBeMr1jdgxECAoG"
  ElementsConfidentialAddress token_address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3jM5PWewjAYfWsrxrGeKAxWw6JsEGLjWym");
  ByteData256 contract_hash;
  bool is_blind = true;
  IssuanceParameter param;
  IssuanceOutputParameter issue_output;
  IssuanceOutputParameter token_output;
  issue_output.confidential_address = asset_address;
  issue_output.amount = asset_amount;
  token_output.confidential_address = token_address;
  token_output.amount = token_amount;
  EXPECT_NO_THROW(
      (param = tx.SetAssetIssuance(outpoint, asset_amount,
                                   issue_output, token_amount,
                                   token_output, is_blind,
                                   contract_hash)));

  Privkey master_blinding_key("fbbd7894006dd0e02000eb6646c6685bcceddabc8d68b93e9a1a2c78d1e7bbec");
  IssuanceBlindingKeyPair issue_key;
  issue_key.asset_key = ConfidentialTransaction::GetIssuanceBlindingKey(
      master_blinding_key, outpoint.GetTxid(), outpoint.GetVout());
  issue_key.token_key = issue_key.asset_key;
  BlindParameter utxo_param;
  utxo_param.asset = ConfidentialAssetId("849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735");
  utxo_param.value = ConfidentialValue(Amount(int64_t{49980000}));

  std::map<OutPoint, BlindParameter> utxo_info_map;
  utxo_info_map.emplace(outpoint, utxo_param);
  std::map<OutPoint, IssuanceBlindingKeyPair> issuance_key_map;
  issuance_key_map.emplace(outpoint, issue_key);
  std::vector<ElementsConfidentialAddress> confidential_key_list;
  confidential_key_list.push_back(address);
  // confidential_key_list.push_back(asset_address);
  // confidential_key_list.push_back(token_address);
  EXPECT_NO_THROW(tx.BlindTransaction(
      utxo_info_map, issuance_key_map, confidential_key_list));
  EXPECT_EQ(tx.GetHex().size(), 43998);
  std::vector<ConfidentialTxOutReference> txouts = tx.GetTxOutList();
  EXPECT_EQ(txouts.size(), 4);
  if (txouts.size() == 4) {
    EXPECT_TRUE(txouts[0].GetConfidentialValue().HasBlinding());
    EXPECT_FALSE(txouts[1].GetConfidentialValue().HasBlinding());
    EXPECT_TRUE(txouts[2].GetConfidentialValue().HasBlinding());
    EXPECT_TRUE(txouts[3].GetConfidentialValue().HasBlinding());
  }
  // EXPECT_STREQ(tx.GetHex().c_str(), "");

  std::vector<UnblindParameter> unblind_param;
  EXPECT_NO_THROW(unblind_param = tx.UnblindIssuance(outpoint, issue_key));
  EXPECT_STREQ(unblind_param[0].asset.GetHex().c_str(), param.asset.GetHex().c_str());
  EXPECT_EQ(unblind_param[0].value.GetAmount().GetSatoshiValue(), asset_amount.GetSatoshiValue());
  EXPECT_STREQ(unblind_param[1].asset.GetHex().c_str(), param.token.GetHex().c_str());
  EXPECT_EQ(unblind_param[1].value.GetAmount().GetSatoshiValue(), token_amount.GetSatoshiValue());
}